

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.c
# Opt level: O1

sysbvm_tuple_t
sysbvm_methodDictionary_createWithCapacity(sysbvm_context_t *context,size_t initialCapacity)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  sysbvm_object_tuple_t *psVar3;
  sysbvm_tuple_t sVar4;
  long lVar5;
  ulong slotCount;
  
  psVar3 = sysbvm_context_allocatePointerTuple(context,(context->roots).methodDictionaryType,2);
  (psVar3->field_1).pointers[0] = 0xb;
  if (99 < initialCapacity * 0x82) {
    auVar2._8_8_ = 0;
    auVar2._0_8_ = initialCapacity * 0x82 >> 2;
    slotCount = SUB168(auVar2 * ZEXT816(0x28f5c28f5c28f5c3),8) >> 1 & 0xfffffffffffffffe;
    sVar4 = sysbvm_array_create(context,slotCount);
    psVar3[1].header.field_0.typePointer = sVar4;
    lVar5 = 0;
    do {
      uVar1 = psVar3[1].header.field_0.typePointer;
      if ((uVar1 & 0xf) == 0 && uVar1 != 0) {
        *(undefined8 *)(uVar1 + 0x10 + lVar5 * 8) = 0x3f;
      }
      lVar5 = lVar5 + 1;
    } while (slotCount + (slotCount == 0) != lVar5);
  }
  return (sysbvm_tuple_t)psVar3;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_methodDictionary_createWithCapacity(sysbvm_context_t *context, size_t initialCapacity)
{
    size_t requiredStorageCapacity = initialCapacity * 130 / 100;
    sysbvm_methodDictionary_t *result = (sysbvm_methodDictionary_t*)sysbvm_context_allocatePointerTuple(context, context->roots.methodDictionaryType, SYSBVM_SLOT_COUNT_FOR_STRUCTURE_TYPE(sysbvm_methodDictionary_t));
    result->size = sysbvm_tuple_size_encode(context, 0);
    if(requiredStorageCapacity > 0)
    {
        size_t entryCount = requiredStorageCapacity * 2;
        result->storage = sysbvm_array_create(context, entryCount);
        for(size_t i = 0; i < entryCount; ++i)
            sysbvm_array_atPut(result->storage, i, SYSBVM_HASHTABLE_EMPTY_ELEMENT_TUPLE);
    }

    return (sysbvm_tuple_t)result;
}